

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O2

bool crnlib::texture_conversion::process(convert_params *params,convert_stats *stats)

{
  format fVar1;
  format fVar2;
  mip_level *this;
  double dVar3;
  uint3 uVar4;
  vector<crnlib::mip_level_*> *this_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pixel_format pVar8;
  uint uVar9;
  mipmapped_texture *pmVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  mip_level *init0;
  pixel_format fmt;
  crn_mipmap_params *pcVar18;
  texture_type tVar19;
  crn_file_type cVar20;
  byte bVar21;
  dynamic_string fn;
  progress_params progress_state;
  face_vec face;
  dynamic_string ext;
  dynamic_string dir;
  dynamic_string drv;
  uint32 actual_quality_level;
  uint uStack_47c;
  char *local_478;
  undefined4 local_470;
  ushort local_46c;
  progress_callback_func local_468;
  vector<crnlib::mip_level_*> *pvStack_460;
  undefined8 local_458;
  task_pool *local_450;
  timer tm;
  crn_mipmap_params mipmap_params;
  dynamic_string local_3d0;
  timer t;
  crn_comp_params local_3a8;
  
  bVar21 = 0;
  tVar19 = params->m_texture_type;
  memcpy(&local_3a8,&params->m_comp_params,0x378);
  pmVar10 = (mipmapped_texture *)&params->m_mipmap_params;
  pcVar18 = &mipmap_params;
  for (lVar14 = 0x14; lVar14 != 0; lVar14 = lVar14 + -1) {
    pcVar18->m_size_of_obj = *(crn_uint32 *)&pmVar10->m_name;
    pmVar10 = (mipmapped_texture *)((long)pmVar10 + (ulong)bVar21 * -8 + 4);
    pcVar18 = (crn_mipmap_params *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
  }
  progress_state.m_canceled = false;
  progress_state.m_start_percentage = 0;
  params->m_status = false;
  progress_state.m_pParams = params;
  dynamic_string::clear(&params->m_error_message);
  if (params->m_pIntermediate_texture != (mipmapped_texture *)0x0) {
    crnlib_delete<crnlib::mipmapped_texture>(params->m_pIntermediate_texture);
    params->m_pIntermediate_texture = (mipmapped_texture *)0x0;
  }
  pmVar10 = crnlib_new<crnlib::mipmapped_texture,crnlib::mipmapped_texture>
                      ((crnlib *)params->m_pInput_texture,pmVar10);
  params->m_pIntermediate_texture = pmVar10;
  pmVar10 = params->m_pInput_texture;
  if ((params->m_unflip == true) && (bVar5 = mipmapped_texture::is_flipped(pmVar10), bVar5)) {
    console::info("Unflipping texture");
    mipmapped_texture::unflip(pmVar10,true,true);
  }
  if (params->m_y_flip == true) {
    console::info("Flipping texture on Y axis");
    bVar5 = mipmapped_texture::flip_y(pmVar10,params->m_dst_file_type == cFormatKTX);
    if (!bVar5) {
      console::warning("Failed flipping texture on Y axis");
    }
  }
  fmt = params->m_dst_format;
  if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5A)) &&
     ((pmVar10->m_comp_flags & cCompFlagAValid) == 0)) {
    console::warning(
                    "Output format is alpha-only, but input doesn\'t have alpha, so setting alpha to luminance."
                    );
    local_478 = (char *)0x4;
    local_470 = 0x1000001;
    local_46c = 1;
    local_468 = (progress_callback_func)0x0;
    pvStack_460 = (vector<crnlib::mip_level_*> *)0x0;
    _actual_quality_level = (mip_level *)0x80;
    local_458._0_4_ = 0;
    local_458._4_4_ = 100;
    local_450 = (task_pool *)0x0;
    mipmapped_texture::convert(pmVar10,PIXEL_FMT_A8,(pack_params *)&actual_quality_level);
    if (tVar19 == cTextureTypeNormalMap) {
      tVar19 = cTextureTypeRegularMap;
    }
    fmt = params->m_dst_format;
  }
  iVar7 = pixel_format_helpers::is_dxt(fmt);
  if ((iVar7 == 0) || ((uint)params->m_dst_file_type < 3)) {
    if (fmt == PIXEL_FMT_INVALID) goto LAB_0014acab;
LAB_0014acc3:
    if (fmt == PIXEL_FMT_DXT1) {
LAB_0014ada1:
      fmt = PIXEL_FMT_DXT1;
      if ((local_3a8.m_flags & 0x80) != 0) goto LAB_0014adb0;
    }
    else if (fmt == PIXEL_FMT_DXT1A) {
LAB_0014ace2:
      local_3a8.m_flags = local_3a8.m_flags | 0x80;
LAB_0014adb0:
      fmt = PIXEL_FMT_DXT1A;
      if (params->m_dst_file_type == cFormatCRN) {
        console::warning(
                        "CRN file format does not support DXT1A compressed textures - converting to DXT5 instead."
                        );
        fmt = PIXEL_FMT_DXT5;
      }
    }
LAB_0014ae10:
    if (tVar19 == cTextureTypeNormalMap) goto LAB_0014ae16;
LAB_0014ae31:
    bVar21 = (byte)local_3a8.m_flags;
  }
  else {
    console::warning(
                    "Output file format does not support DXTc - automatically choosing a non-DXT pixel format."
                    );
LAB_0014acab:
    pVar8 = pmVar10->m_format;
    fmt = pVar8;
    if (params->m_always_use_source_pixel_format != false) goto LAB_0014acc3;
    fVar2 = pmVar10->m_source_file_type;
    fVar1 = params->m_dst_file_type;
    if (fVar1 == cFormatDDS) {
      fmt = PIXEL_FMT_DXT5_AGBR;
      if ((uint)fVar2 < 3) {
        fmt = pVar8;
      }
      if ((uint)fVar2 < 3 || tVar19 == cTextureTypeNormalMap) goto LAB_0014acc3;
      bVar5 = pixel_format_helpers::has_alpha(pVar8);
      if (bVar5) {
        fmt = PIXEL_FMT_DXT5;
        if (-1 < (char)local_3a8.m_flags) goto LAB_0014ae31;
        goto LAB_0014ace2;
      }
      goto LAB_0014ada1;
    }
    if (fVar1 == cFormatKTX) {
      if ((uint)fVar2 < 3) goto LAB_0014acc3;
      bVar5 = pixel_format_helpers::has_alpha(pVar8);
      if (tVar19 == cTextureTypeNormalMap) {
        fmt = PIXEL_FMT_R8G8B8;
        if (bVar5) {
          fmt = PIXEL_FMT_A8R8G8B8;
        }
        goto LAB_0014ae16;
      }
      fmt = PIXEL_FMT_ETC1;
      if (bVar5) {
        fmt = PIXEL_FMT_ETC2A;
      }
      goto LAB_0014ae31;
    }
    if (fVar1 != cFormatCRN) {
      if ((pVar8 == PIXEL_FMT_L8) || (pVar8 == PIXEL_FMT_A8L8)) {
        bVar5 = pixel_format_helpers::has_alpha(pVar8);
        pVar8 = PIXEL_FMT_A8L8;
        fmt = PIXEL_FMT_L8;
      }
      else {
        bVar5 = pixel_format_helpers::has_alpha(pVar8);
        pVar8 = PIXEL_FMT_A8R8G8B8;
        fmt = PIXEL_FMT_R8G8B8;
      }
      if (bVar5 != false) {
        fmt = pVar8;
      }
      goto LAB_0014ae10;
    }
    if ((tVar19 != cTextureTypeNormalMap) ||
       (iVar7 = pixel_format_helpers::is_dxt(pVar8), iVar7 != 0)) goto LAB_0014acc3;
    fmt = PIXEL_FMT_DXT5_AGBR;
LAB_0014ae16:
    mipmap_params.m_gamma_filtering = 0;
    bVar21 = 0;
  }
  bVar5 = pixel_format_helpers::is_pixel_format_non_srgb(fmt);
  if ((bVar5) && ((bVar21 & 1) != 0)) {
    bVar21 = 0;
    console::message(
                    "Output pixel format is swizzled or not RGB, disabling perceptual color metrics"
                    );
  }
  bVar5 = pixel_format_helpers::is_normal_map(fmt);
  if (bVar5) {
    if ((bVar21 & 1) == 0) {
      bVar21 = 0;
    }
    else {
      bVar21 = 0;
      console::message(
                      "Output pixel format is intended for normal maps, disabling perceptual color metrics"
                      );
    }
  }
  bVar6 = texture_file_types::supports_mipmaps(params->m_dst_file_type);
  fVar2 = params->m_dst_file_type;
  bVar5 = params->m_write_mipmaps_to_multiple_files;
  if (params->m_param_debugging == true) {
    convert_params::print(params);
    console::debug("\nTexture conversion compression parameters:");
    console::debug("          Desired bitrate: %3.3f",SUB84((double)local_3a8.m_target_bitrate,0));
    console::debug("              CRN Quality: %i",(ulong)local_3a8.m_quality_level);
    console::debug("CRN C endpoints/selectors: %u %u",
                   (ulong)local_3a8.m_crn_color_endpoint_palette_size,
                   (ulong)local_3a8.m_crn_color_selector_palette_size);
    console::debug("CRN A endpoints/selectors: %u %u",
                   (ulong)local_3a8.m_crn_alpha_endpoint_palette_size,
                   (ulong)local_3a8.m_crn_alpha_selector_palette_size);
    console::debug("     DXT both block types: %u, Alpha threshold: %u",
                   (ulong)(local_3a8.m_flags >> 3 & 1),(ulong)local_3a8.m_dxt1a_alpha_threshold);
    pcVar11 = crn_get_dxt_quality_string(local_3a8.m_dxt_quality);
    console::debug("  DXT compression quality: %s",pcVar11);
    console::debug("               Perceptual: %u, Large Blocks: %u",(ulong)(local_3a8.m_flags & 1),
                   (ulong)(local_3a8.m_flags >> 1 & 1));
    pcVar11 = get_dxt_compressor_name(local_3a8.m_dxt_compressor_type);
    console::debug("               Compressor: %s",pcVar11);
    console::debug(" Disable endpoint caching: %u",(ulong)(local_3a8.m_flags >> 5 & 1));
    console::debug("       Grayscale sampling: %u",(ulong)(local_3a8.m_flags >> 8 & 1));
    console::debug("       Max helper threads: %u",(ulong)local_3a8.m_num_helper_threads);
    console::debug("");
    console::debug("\nTexture conversion MIP-map parameters:");
    pcVar11 = crn_get_mip_mode_name(mipmap_params.m_mode);
    console::debug("           Mode: %s",pcVar11);
    pcVar11 = crn_get_mip_filter_name(mipmap_params.m_filter);
    console::debug("         Filter: %s",pcVar11);
    console::debug("Gamma filtering: %u, Gamma: %2.2f",SUB84((double)mipmap_params.m_gamma,0),
                   (ulong)mipmap_params.m_gamma_filtering);
    console::debug("     Blurriness: %2.2f",SUB84((double)mipmap_params.m_blurriness,0));
    console::debug("    Renormalize: %u",(ulong)mipmap_params.m_renormalize);
    console::debug("          Tiled: %u",(ulong)mipmap_params.m_tiled);
    console::debug("     Max Levels: %u",(ulong)mipmap_params.m_max_levels);
    console::debug(" Min level size: %u",(ulong)mipmap_params.m_min_mip_size);
    console::debug("       window: %u %u %u %u",(ulong)mipmap_params.m_window_left,
                   (ulong)mipmap_params.m_window_top,(ulong)mipmap_params.m_window_right);
    pcVar11 = crn_get_scale_mode_desc(mipmap_params.m_scale_mode);
    console::debug("   scale mode: %s",pcVar11);
    console::debug("        scale: %f %f",SUB84((double)mipmap_params.m_scale_x,0),
                   (double)mipmap_params.m_scale_y);
    console::debug("        clamp: %u %u, clamp_scale: %u",(ulong)mipmap_params.m_clamp_width,
                   (ulong)mipmap_params.m_clamp_height,(ulong)mipmap_params.m_clamp_scale);
    console::debug("");
  }
  bVar5 = create_texture_mipmaps
                    (pmVar10,&local_3a8,&mipmap_params,(bool)(2 < (uint)fVar2 & bVar5 | bVar6));
  if (!bVar5) {
    convert_error(params,"Failed creating texture mipmaps!");
    return false;
  }
  pVar8 = pmVar10->m_format;
  cVar20 = cCRNFileTypeCRN;
  bVar5 = false;
  if ((pVar8 != fmt) && ((pVar8 == PIXEL_FMT_DXT1A || (bVar5 = true, pVar8 == PIXEL_FMT_DXT1)))) {
    bVar5 = fmt != PIXEL_FMT_DXT1A && fmt != PIXEL_FMT_DXT1;
  }
  timer::timer(&t);
  timer::start(&t);
  if (params->m_dst_file_type != cFormatCRN) {
    if (((params->m_dst_file_type != cFormatDDS) ||
        (iVar7 = pixel_format_helpers::is_dxt(fmt), iVar7 == 0)) ||
       ((local_3a8.m_target_bitrate <= 0.0 && (0xfe < local_3a8.m_quality_level)))) {
      if ((0.0 < local_3a8.m_target_bitrate) || (local_3a8.m_quality_level < 0xff)) {
        console::warning(
                        "Target bitrate/quality level is not supported for this output file format.\n"
                        );
      }
      if (bVar5) {
        local_458._0_4_ = 0;
        local_458._4_4_ = 100;
        local_450 = (task_pool *)0x0;
        local_470 = CONCAT31(0x10000,bVar21) & 0xffffff01;
        local_468 = dxt_progress_callback_func;
        pvStack_460 = (vector<crnlib::mip_level_*> *)&progress_state;
        local_478 = (char *)CONCAT44(local_3a8.m_dxt_compressor_type,local_3a8.m_dxt_quality);
        uVar4 = CONCAT12((char)(local_3a8.m_flags >> 8),(undefined2)local_470);
        local_470 = CONCAT13(local_470._3_1_,uVar4) & 0xff01ffff;
        if ((local_3a8.m_flags & 0x88) == 0) {
          local_470 = uVar4 & 0x1ffff;
        }
        _actual_quality_level =
             (mip_level *)CONCAT44(local_3a8.m_num_helper_threads,local_3a8.m_dxt1a_alpha_threshold)
        ;
        local_46c = CONCAT11((byte)local_3a8.m_flags >> 4,(local_3a8.m_flags & 0x20) == 0) & 0x1ff;
        pcVar11 = pixel_format_helpers::get_pixel_format_string(pmVar10->m_format);
        pcVar12 = pixel_format_helpers::get_pixel_format_string(fmt);
        console::info("Converting texture format from %s to %s",pcVar11,pcVar12);
        timer::timer(&tm);
        timer::start(&tm);
        bVar5 = mipmapped_texture::convert(pmVar10,fmt,(pack_params *)&actual_quality_level);
        dVar3 = timer::get_elapsed_secs(&tm);
        console::info("");
        if (bVar5) {
          console::info("Texture format conversion took %3.3fs",SUB84(dVar3,0));
          goto LAB_0014b399;
        }
        if (progress_state.m_canceled == true) {
          params->m_canceled = true;
        }
        else {
          convert_error(params,"Failed converting texture to output format!");
        }
      }
      else {
LAB_0014b399:
        if (params->m_write_mipmaps_to_multiple_files == true) {
          uVar9 = (pmVar10->m_faces).m_size;
          for (uVar16 = 0; uVar16 < uVar9; uVar16 = uVar16 + 1) {
            uVar17 = 0;
            uVar13 = 1;
            while( true ) {
              if (uVar13 == 0) {
                uVar15 = 0;
              }
              else {
                uVar15 = (ulong)((pmVar10->m_faces).m_p)->m_size;
              }
              if (uVar15 <= uVar17) break;
              pcVar11 = (params->m_dst_filename).m_pStr;
              if (pcVar11 == (char *)0x0) {
                pcVar11 = "";
              }
              dynamic_string::dynamic_string((dynamic_string *)&tm,pcVar11);
              drv.m_buf_size = 0;
              drv.m_len = 0;
              drv.m_pStr = (char *)0x0;
              dir.m_buf_size = 0;
              dir.m_len = 0;
              dir.m_pStr = (char *)0x0;
              fn.m_buf_size = 0;
              fn.m_len = 0;
              fn.m_pStr = (char *)0x0;
              ext.m_buf_size = 0;
              ext.m_len = 0;
              ext.m_pStr = (char *)0x0;
              pcVar11 = (params->m_dst_filename).m_pStr;
              if (pcVar11 == (char *)0x0) {
                pcVar11 = "";
              }
              bVar5 = file_utils::split_path(pcVar11,&drv,&dir,&fn,&ext);
              if (!bVar5) {
                dynamic_string::~dynamic_string(&ext);
                dynamic_string::~dynamic_string(&fn);
                dynamic_string::~dynamic_string(&dir);
                dynamic_string::~dynamic_string(&drv);
                dynamic_string::~dynamic_string((dynamic_string *)&tm);
                goto LAB_0014b8f8;
              }
              dynamic_string::dynamic_string
                        ((dynamic_string *)&actual_quality_level,cVarArg,"_face%u_mip%u",uVar16);
              pcVar11 = local_478;
              if (local_478 == (char *)0x0) {
                pcVar11 = "";
              }
              dynamic_string::append(&fn,pcVar11);
              dynamic_string::~dynamic_string((dynamic_string *)&actual_quality_level);
              operator+((crnlib *)&local_3d0,&drv,&dir);
              operator+((crnlib *)&face,&local_3d0,&fn);
              operator+((crnlib *)&actual_quality_level,(dynamic_string *)&face,&ext);
              dynamic_string::operator=
                        ((dynamic_string *)&tm,(dynamic_string *)&actual_quality_level);
              dynamic_string::~dynamic_string((dynamic_string *)&actual_quality_level);
              dynamic_string::~dynamic_string((dynamic_string *)&face);
              dynamic_string::~dynamic_string(&local_3d0);
              this = (pmVar10->m_faces).m_p[uVar16].m_p[uVar17];
              init0 = (mip_level *)0x1;
              vector<crnlib::vector<crnlib::mip_level_*>_>::vector
                        ((vector<crnlib::vector<crnlib::mip_level_*>_> *)&face,1);
              this_00 = face.m_p;
              _actual_quality_level =
                   crnlib_new<crnlib::mip_level,crnlib::mip_level>((crnlib *)this,init0);
              vector<crnlib::mip_level_*>::push_back(this_00,(mip_level **)&actual_quality_level);
              mipmapped_texture::mipmapped_texture((mipmapped_texture *)&actual_quality_level);
              mipmapped_texture::assign((mipmapped_texture *)&actual_quality_level,&face);
              console::info("Writing texture face %u mip level %u to file %s",uVar16,
                            uVar17 & 0xffffffff);
              pcVar11 = (char *)tm.m_stop_time;
              if (tm.m_stop_time == 0) {
                pcVar11 = "";
              }
              bVar5 = mipmapped_texture::write_to_file
                                ((mipmapped_texture *)&actual_quality_level,pcVar11,
                                 params->m_dst_file_type,(crn_comp_params *)0x0,(uint32 *)0x0,
                                 (float *)0x0,0);
              if (!bVar5) {
                convert_error(params,"Failed writing output file!");
              }
              mipmapped_texture::~mipmapped_texture((mipmapped_texture *)&actual_quality_level);
              vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&face);
              dynamic_string::~dynamic_string(&ext);
              dynamic_string::~dynamic_string(&fn);
              dynamic_string::~dynamic_string(&dir);
              dynamic_string::~dynamic_string(&drv);
              dynamic_string::~dynamic_string((dynamic_string *)&tm);
              if (!bVar5) goto LAB_0014b8f8;
              uVar17 = uVar17 + 1;
              uVar9 = (pmVar10->m_faces).m_size;
              uVar13 = uVar9;
            }
          }
          bVar5 = true;
          goto LAB_0014b8fa;
        }
        pcVar11 = (params->m_dst_filename).m_pStr;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        console::message("Writing texture to file: \"%s\"",pcVar11);
        pcVar11 = (params->m_dst_filename).m_pStr;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        bVar5 = mipmapped_texture::write_to_file
                          (pmVar10,pcVar11,params->m_dst_file_type,(crn_comp_params *)0x0,
                           (uint32 *)0x0,(float *)0x0,0);
        if (bVar5) {
          bVar5 = true;
          if (params->m_no_stats == false) {
            pcVar11 = (params->m_pInput_texture->m_name).m_pStr;
            if ((EVP_PKEY_CTX *)pcVar11 == (EVP_PKEY_CTX *)0x0) {
              pcVar11 = "";
            }
            iVar7 = convert_stats::init(stats,(EVP_PKEY_CTX *)pcVar11);
            if ((char)iVar7 == '\0') {
              pcVar11 = (params->m_pInput_texture->m_name).m_pStr;
              pcVar12 = "";
              if (pcVar11 != (char *)0x0) {
                pcVar12 = pcVar11;
              }
              console::warning("Unable to compute output statistics for file: %s",pcVar12);
            }
          }
          goto LAB_0014b8fa;
        }
        convert_error(params,"Failed writing output file!");
      }
LAB_0014b8f8:
      bVar5 = false;
      goto LAB_0014b8fa;
    }
    cVar20 = (crn_file_type)(params->m_dst_file_type != cFormatCRN);
  }
  local_3a8.m_pProgress_func = crn_progress_callback;
  local_3a8.m_pProgress_func_data = &progress_state;
  local_3a8.m_flags = (uint)(bVar21 & 1) | local_3a8.m_flags & 0xfffffffe;
  local_3a8.m_file_type = cVar20;
  local_3a8.m_format = pixel_format_helpers::convert_pixel_format_to_best_crn_format(fmt);
  pcVar12 = crn_get_format_string(local_3a8.m_format);
  pcVar11 = (params->m_dst_filename).m_pStr;
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  console::message("Writing %s texture to file: \"%s\"",pcVar12,pcVar11);
  pcVar11 = (params->m_dst_filename).m_pStr;
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  bVar5 = mipmapped_texture::write_to_file
                    (pmVar10,pcVar11,params->m_dst_file_type,&local_3a8,&actual_quality_level,
                     (float *)&tm,0);
  if (bVar5) {
    if (params->m_no_stats == false) {
      pcVar11 = (params->m_pInput_texture->m_name).m_pStr;
      if ((EVP_PKEY_CTX *)pcVar11 == (EVP_PKEY_CTX *)0x0) {
        pcVar11 = "";
      }
      iVar7 = convert_stats::init(stats,(EVP_PKEY_CTX *)pcVar11);
      if ((char)iVar7 == '\0') {
        pcVar11 = (params->m_pInput_texture->m_name).m_pStr;
        pcVar12 = "";
        if (pcVar11 != (char *)0x0) {
          pcVar12 = pcVar11;
        }
        console::warning("Unable to compute output statistics for file: %s",pcVar12);
      }
    }
  }
  else {
    convert_error(params,"Failed writing output file!");
  }
LAB_0014b8fa:
  console::progress("");
  if (progress_state.m_canceled == true) {
    params->m_canceled = true;
  }
  else {
    dVar3 = timer::get_elapsed_secs(&t);
    if (bVar5 != false) {
      if (params->m_param_debugging == true) {
        pcVar11 = pixel_format_helpers::get_pixel_format_string(pmVar10->m_format);
        pcVar12 = pixel_format_helpers::get_pixel_format_string(fmt);
        console::info("Work texture format: %s, desired destination format: %s",pcVar11,pcVar12);
      }
      console::message("Texture successfully written in %3.3fs",SUB84(dVar3,0));
      if (params->m_debugging != false) {
        crnlib_print_mem_stats();
      }
      params->m_status = true;
      return true;
    }
    _actual_quality_level = (mip_level *)((ulong)_actual_quality_level & 0xffffffff00000000);
    local_478 = (char *)0x0;
    pcVar11 = (params->m_dst_filename).m_pStr;
    if (pcVar11 == (char *)0x0) {
      pcVar11 = "";
    }
    if ((pmVar10->m_last_error).m_len == 0) {
      dynamic_string::format
                ((dynamic_string *)&actual_quality_level,"Failed writing texture to file \"%s\"",
                 pcVar11);
    }
    else {
      pcVar12 = (pmVar10->m_last_error).m_pStr;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      dynamic_string::format
                ((dynamic_string *)&actual_quality_level,
                 "Failed writing texture to file \"%s\", Reason: %s",pcVar11,pcVar12);
    }
    pcVar11 = "";
    if (local_478 != (char *)0x0) {
      pcVar11 = local_478;
    }
    convert_error(params,pcVar11);
    dynamic_string::~dynamic_string((dynamic_string *)&actual_quality_level);
  }
  return false;
}

Assistant:

bool process(convert_params& params, convert_stats& stats) {
  texture_type tex_type = params.m_texture_type;

  crn_comp_params comp_params(params.m_comp_params);
  crn_mipmap_params mipmap_params(params.m_mipmap_params);

  progress_params progress_state;
  progress_state.m_pParams = &params;
  progress_state.m_canceled = false;
  progress_state.m_start_percentage = 0;

  params.m_status = false;
  params.m_error_message.clear();

  if (params.m_pIntermediate_texture) {
    crnlib_delete(params.m_pIntermediate_texture);
    params.m_pIntermediate_texture = NULL;
  }

  params.m_pIntermediate_texture = crnlib_new<mipmapped_texture>(*params.m_pInput_texture);

  mipmapped_texture& work_tex = *params.m_pInput_texture;

  if ((params.m_unflip) && (work_tex.is_flipped())) {
    console::info("Unflipping texture");
    work_tex.unflip(true, true);
  }

  if (params.m_y_flip) {
    console::info("Flipping texture on Y axis");

    // This is awkward - if we're writing to KTX, then go ahead and properly update the work texture's orientation flags.
    // Otherwise, don't bother updating the orientation flags because the writer may then attempt to unflip the texture before writing to formats
    // that don't support flipped textures (ugh).
    const bool bOutputFormatSupportsFlippedTextures = params.m_dst_file_type == texture_file_types::cFormatKTX;
    if (!work_tex.flip_y(bOutputFormatSupportsFlippedTextures)) {
      console::warning("Failed flipping texture on Y axis");
    }
  }

  if ((params.m_dst_format != PIXEL_FMT_INVALID) && (pixel_format_helpers::is_alpha_only(params.m_dst_format))) {
    if ((work_tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid) == 0) {
      console::warning("Output format is alpha-only, but input doesn't have alpha, so setting alpha to luminance.");

      work_tex.convert(PIXEL_FMT_A8, crnlib::dxt_image::pack_params());

      if (tex_type == cTextureTypeNormalMap)
        tex_type = cTextureTypeRegularMap;
    }
  }

  pixel_format dst_format = params.m_dst_format;
  if (pixel_format_helpers::is_dxt(dst_format)) {
    if ((params.m_dst_file_type != texture_file_types::cFormatCRN) &&
        (params.m_dst_file_type != texture_file_types::cFormatDDS) &&
        (params.m_dst_file_type != texture_file_types::cFormatKTX)) {
      console::warning("Output file format does not support DXTc - automatically choosing a non-DXT pixel format.");
      dst_format = PIXEL_FMT_INVALID;
    }
  }

  if (dst_format == PIXEL_FMT_INVALID) {
    // Caller didn't specify a format to use, so try to pick something reasonable.
    // This is actually much trickier than it seems, and the current approach kind of sucks.
    dst_format = choose_pixel_format(params, comp_params, work_tex, tex_type);
  }

  if ((dst_format == PIXEL_FMT_DXT1) && (comp_params.get_flag(cCRNCompFlagDXT1AForTransparency)))
    dst_format = PIXEL_FMT_DXT1A;
  else if (dst_format == PIXEL_FMT_DXT1A)
    comp_params.set_flag(cCRNCompFlagDXT1AForTransparency, true);

  if ((dst_format == PIXEL_FMT_DXT1A) && (params.m_dst_file_type == texture_file_types::cFormatCRN)) {
    console::warning("CRN file format does not support DXT1A compressed textures - converting to DXT5 instead.");
    dst_format = PIXEL_FMT_DXT5;
  }

  const bool is_normal_map = (tex_type == cTextureTypeNormalMap);
  bool perceptual = comp_params.get_flag(cCRNCompFlagPerceptual);
  if (is_normal_map) {
    perceptual = false;
    mipmap_params.m_gamma_filtering = false;
  }

  if (pixel_format_helpers::is_pixel_format_non_srgb(dst_format)) {
    if (perceptual) {
      console::message("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
      perceptual = false;
    }
  }

  if (pixel_format_helpers::is_normal_map(dst_format)) {
    if (perceptual)
      console::message("Output pixel format is intended for normal maps, disabling perceptual color metrics");

    perceptual = false;
  }

  bool generate_mipmaps = texture_file_types::supports_mipmaps(params.m_dst_file_type);
  if ((params.m_write_mipmaps_to_multiple_files) &&
      ((params.m_dst_file_type != texture_file_types::cFormatCRN) && (params.m_dst_file_type != texture_file_types::cFormatDDS) && (params.m_dst_file_type != texture_file_types::cFormatKTX))) {
    generate_mipmaps = true;
  }

  if (params.m_param_debugging) {
    params.print();

    print_comp_params(comp_params);
    print_mipmap_params(mipmap_params);
  }

  if (!create_texture_mipmaps(work_tex, comp_params, mipmap_params, generate_mipmaps))
    return convert_error(params, "Failed creating texture mipmaps!");

  bool formats_differ = work_tex.get_format() != dst_format;
  if (formats_differ) {
    if (pixel_format_helpers::is_dxt1(work_tex.get_format()) && pixel_format_helpers::is_dxt1(dst_format))
      formats_differ = false;
  }

  bool status = false;

  timer t;
  t.start();

  if ((params.m_dst_file_type == texture_file_types::cFormatCRN) ||
      ((params.m_dst_file_type == texture_file_types::cFormatDDS) && (pixel_format_helpers::is_dxt(dst_format)) &&
       //((formats_differ) || (comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel))
       ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)))) {
    status = write_compressed_texture(work_tex, params, comp_params, dst_format, progress_state, perceptual, stats);
  } else {
    if ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)) {
      console::warning("Target bitrate/quality level is not supported for this output file format.\n");
    }
    status = convert_and_write_normal_texture(work_tex, params, comp_params, dst_format, progress_state, formats_differ, perceptual, stats);
  }

  console::progress("");

  if (progress_state.m_canceled) {
    params.m_canceled = true;
    return false;
  }

  double total_write_time = t.get_elapsed_secs();

  if (status) {
    if (params.m_param_debugging)
      console::info("Work texture format: %s, desired destination format: %s", pixel_format_helpers::get_pixel_format_string(work_tex.get_format()), pixel_format_helpers::get_pixel_format_string(dst_format));

    console::message("Texture successfully written in %3.3fs", total_write_time);
  } else {
    dynamic_string str;

    if (work_tex.get_last_error().is_empty())
      str.format("Failed writing texture to file \"%s\"", params.m_dst_filename.get_ptr());
    else
      str.format("Failed writing texture to file \"%s\", Reason: %s", params.m_dst_filename.get_ptr(), work_tex.get_last_error().get_ptr());

    return convert_error(params, str.get_ptr());
  }

  if (params.m_debugging) {
    crnlib_print_mem_stats();
  }

  params.m_status = true;
  return true;
}